

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O0

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::begin(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        *this)

{
  STLHashMap<unsigned_long,_unsigned_long> *in_RSI;
  const_iterator *in_RDI;
  const_iterator *unaff_retaddr;
  
  const_iterator::const_iterator(unaff_retaddr,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  return in_RDI;
}

Assistant:

const_iterator begin() const { return const_iterator(_bits); }